

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnStartFunction(BinaryReaderIR *this,Index func_index)

{
  char *pcVar1;
  Offset OVar2;
  Module *this_00;
  size_t sVar3;
  StartModuleField *pSVar4;
  Location loc;
  Var start;
  _Head_base<0UL,_wabt::StartModuleField_*,_false> local_d0;
  Var local_c8;
  Var local_78;
  
  local_c8.loc.field_1.field_0.line = 0;
  local_c8.loc.field_1.field_0.first_column = 0;
  local_c8.loc.field_1.field_0.last_column = 0;
  local_c8.loc.filename._M_len = 0;
  local_c8.loc.filename._M_str._0_4_ = 0;
  local_c8.loc.filename._M_str._4_4_ = 0;
  pcVar1 = this->filename_;
  local_c8.loc.filename._M_len = strlen(pcVar1);
  local_c8.loc.filename._M_str._0_4_ = SUB84(pcVar1,0);
  local_c8.loc.filename._M_str._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_c8.loc.field_1.field_0.line = (int)OVar2;
  local_c8.loc.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  Var::Var(&local_78,func_index,&local_c8.loc);
  this_00 = this->module_;
  pcVar1 = this->filename_;
  sVar3 = strlen(pcVar1);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  pSVar4 = (StartModuleField *)operator_new(0x88);
  Var::Var(&local_c8,&local_78);
  (pSVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
  (pSVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
  (pSVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.loc.filename._M_len =
       sVar3;
  (pSVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.loc.filename._M_str =
       pcVar1;
  (pSVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.loc.field_1.field_1.
  offset = OVar2;
  *(undefined8 *)
   ((long)&(pSVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.loc.field_1
   + 8) = 0;
  (pSVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.type_ = Start;
  (pSVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__StartModuleField_001782f0;
  Var::Var(&pSVar4->start,&local_c8);
  local_d0._M_head_impl = pSVar4;
  Var::~Var(&local_c8);
  Module::AppendField(this_00,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                               *)&local_d0);
  if (local_d0._M_head_impl != (StartModuleField *)0x0) {
    (*((local_d0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_d0._M_head_impl = (StartModuleField *)0x0;
  Var::~Var(&local_78);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnStartFunction(Index func_index) {
  Var start(func_index, GetLocation());
  module_->AppendField(
      std::make_unique<StartModuleField>(start, GetLocation()));
  return Result::Ok;
}